

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_conversion.cpp
# Opt level: O1

void duckdb::IntervalConversionUs
               (Vector *vector,ArrowArray *array,ArrowScanLocalState *scan_state,
               int64_t nested_offset,int64_t parent_offset,idx_t size,int64_t conversion)

{
  void *pvVar1;
  bool bVar2;
  ConversionException *this;
  int64_t *result;
  idx_t iVar3;
  long lVar4;
  string local_50;
  
  lVar4 = parent_offset + array->offset + scan_state->chunk_offset;
  if (nested_offset != -1) {
    lVar4 = array->offset + nested_offset;
  }
  if (size != 0) {
    pvVar1 = array->buffers[1];
    result = (int64_t *)(vector->data + 8);
    iVar3 = 0;
    do {
      result[-1] = 0;
      bVar2 = TryMultiplyOperator::Operation<long,long,long>
                        (*(int64_t *)((long)pvVar1 + iVar3 * 8 + lVar4 * 8),conversion,result);
      if (!bVar2) {
        this = (ConversionException *)__cxa_allocate_exception(0x10);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"Could not convert Interval to Microsecond","");
        ConversionException::ConversionException(this,&local_50);
        __cxa_throw(this,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
      }
      iVar3 = iVar3 + 1;
      result = result + 2;
    } while (size != iVar3);
  }
  return;
}

Assistant:

static void IntervalConversionUs(Vector &vector, ArrowArray &array, const ArrowScanLocalState &scan_state,
                                 int64_t nested_offset, int64_t parent_offset, idx_t size, int64_t conversion) {
	auto tgt_ptr = FlatVector::GetData<interval_t>(vector);
	auto src_ptr =
	    ArrowBufferData<int64_t>(array, 1) + GetEffectiveOffset(array, parent_offset, scan_state, nested_offset);
	for (idx_t row = 0; row < size; row++) {
		tgt_ptr[row].days = 0;
		tgt_ptr[row].months = 0;
		if (!TryMultiplyOperator::Operation(src_ptr[row], conversion, tgt_ptr[row].micros)) {
			throw ConversionException("Could not convert Interval to Microsecond");
		}
	}
}